

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_posix::mb2_iconv_converter::mb2_iconv_converter
          (mb2_iconv_converter *this,string *encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 (*pauVar3) [16];
  void *pvVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
  *this_00;
  iconv_t __cd;
  size_t sVar7;
  int *piVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__p;
  runtime_error *this_01;
  int iVar9;
  char ibuf [2];
  size_t outsize;
  uint32_t obuf [2];
  size_t insize;
  char *out;
  char *in;
  char local_ba [2];
  undefined1 local_b8 [8];
  uint *puStack_b0;
  uint *local_a8;
  size_t local_98;
  uint local_90 [2];
  size_t local_88;
  uint local_7c;
  uint *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  mb2_iconv_converter *local_60;
  __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_base_converter)._vptr_base_converter =
       (_func_int **)&PTR__mb2_iconv_converter_001d15f0;
  (this->first_byte_table_).
  super___shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  paVar1 = &(this->encoding_).field_2;
  (this->encoding_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (encoding->_M_dataplus)._M_p;
  local_60 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->encoding_,pcVar2,pcVar2 + encoding->_M_string_length);
  *(undefined4 *)&this->to_utf_ = 0xffffffff;
  *(undefined4 *)((long)&this->to_utf_ + 4) = 0xffffffff;
  *(undefined4 *)&this->from_utf_ = 0xffffffff;
  *(undefined4 *)((long)&this->from_utf_ + 4) = 0xffffffff;
  local_b8 = (undefined1  [8])0x0;
  puStack_b0 = (uint *)0x0;
  local_a8 = (uint *)0x0;
  local_70 = paVar1;
  local_68 = &this->encoding_;
  __cd = iconv_open("UTF-32LE",(encoding->_M_dataplus)._M_p);
  if (__cd == (iconv_t)0xffffffffffffffff) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_50,"Unsupported encoding",encoding);
    runtime_error::runtime_error(this_01,&local_50);
    __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_58 = (__shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
              *)&this->first_byte_table_;
  iVar9 = 0;
  do {
    local_ba[0] = (char)iVar9;
    local_ba[1] = 0;
    local_50._M_dataplus._M_p = local_ba;
    local_88 = 2;
    local_90[0] = 0xffffffff;
    local_90[1] = 0xffffffff;
    local_98 = 8;
    local_78 = local_90;
    iconv(__cd,(char **)&local_50,&local_88,(char **)&local_78,&local_98);
    if (((local_88 == 0) && (local_98 == 0)) && (local_90[1] == 0)) {
      if (puStack_b0 == local_a8) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,
                   (iterator)puStack_b0,local_90);
      }
      else {
        *puStack_b0 = local_90[0];
LAB_00197cc1:
        puStack_b0 = puStack_b0 + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = local_ba;
      local_88 = 1;
      local_98 = 8;
      local_78 = local_90;
      iconv(__cd,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      sVar7 = iconv(__cd,(char **)&local_50,&local_88,(char **)&local_78,&local_98);
      if (sVar7 == 0xffffffffffffffff) {
        piVar8 = __errno_location();
        local_7c = 0xfffffffe;
        if (*piVar8 != 0x16) goto LAB_00197caa;
      }
      else {
LAB_00197caa:
        local_7c = 0xffffffff;
      }
      if (puStack_b0 != local_a8) {
        *puStack_b0 = local_7c;
        goto LAB_00197cc1;
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,(iterator)puStack_b0,
                 &local_7c);
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 0x100) {
      iconv_close(__cd);
      this_00 = local_58;
      __p = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
      ::reset<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this_00,__p);
      pauVar3 = *(undefined1 (**) [16])this_00;
      pvVar4 = *(void **)*pauVar3;
      auVar6 = *pauVar3;
      uVar5 = *(undefined8 *)pauVar3[1];
      *(undefined1 (*) [8])*pauVar3 = local_b8;
      *(uint **)(*pauVar3 + 8) = puStack_b0;
      *(uint **)pauVar3[1] = local_a8;
      if (pvVar4 != (void *)0x0) {
        _local_b8 = auVar6;
        local_a8 = (uint *)uVar5;
        operator_delete(pvVar4);
      }
      return;
    }
  } while( true );
}

Assistant:

mb2_iconv_converter(std::string const &encoding) :
            encoding_(encoding),
            to_utf_((iconv_t)(-1)),
            from_utf_((iconv_t)(-1))
        {
            iconv_t d = (iconv_t)(-1);
            std::vector<uint32_t> first_byte_table;
            try {
                d = iconv_open(utf32_encoding(),encoding.c_str());
                if(d == (iconv_t)(-1)) {
                    throw booster::runtime_error("Unsupported encoding" + encoding);
                }
                for(unsigned c=0;c<256;c++) {
                    char ibuf[2] = { char(c) , 0 };
                    char *in = ibuf;
                    size_t insize =2;
                    uint32_t obuf[2] = {illegal,illegal};
                    char *out = reinterpret_cast<char *>(obuf);
                    size_t outsize = 8;
                    // Basic sigle codepoint conversion
                    call_iconv(d,&in,&insize,&out,&outsize);
                    if(insize == 0 && outsize == 0 && obuf[1] == 0) {
                        first_byte_table.push_back(obuf[0]);
                        continue;
                    }
                    
                    // Test if this is illegal first byte or incomplete
                    in = ibuf;
                    insize = 1;
                    out = reinterpret_cast<char *>(obuf);
                    outsize = 8;
                    call_iconv(d,0,0,0,0);
                    size_t res = call_iconv(d,&in,&insize,&out,&outsize);
                    
                    // Now if this single byte starts a sequence we add incomplete 
                    // to know to ask that we need two bytes, othewise it may only be
                    // illegal

                    uint32_t point;
                    if(res == (size_t)(-1) && errno == EINVAL)
                        point = incomplete;
                    else
                        point = illegal;
                    first_byte_table.push_back(point);

                }
            }
            catch(...) {
                if(d!=(iconv_t)(-1))
                    iconv_close(d);
                throw;
            }
            iconv_close(d);
            first_byte_table_.reset(new std::vector<uint32_t>());
            first_byte_table_->swap(first_byte_table);
        }